

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O3

void P_LoadSideDefs2(MapData *map,FMissingTextureTracker *missingtex)

{
  double *pdVar1;
  undefined8 *puVar2;
  FileReader *pFVar3;
  int iVar4;
  void *pvVar5;
  ulong uVar6;
  long lVar7;
  uint *puVar8;
  long lVar9;
  side_t *psVar10;
  sector_t_conflict *sec;
  double dVar11;
  undefined1 auVar12 [16];
  double dVar13;
  intmapsidedef_t imsd;
  
  pFVar3 = map->MapLumps[3].Reader;
  if (pFVar3 == (FileReader *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = (ulong)(uint)pFVar3->Length;
  }
  pvVar5 = operator_new__(uVar6);
  lVar7 = pFVar3->Length;
  map->file = pFVar3;
  (*(pFVar3->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar3,0,0);
  (*(map->file->super_FileReaderBase)._vptr_FileReaderBase[2])(map->file,pvVar5,(long)(int)lVar7);
  if (0 < numsides) {
    lVar9 = 4;
    lVar7 = 0;
    uVar6 = 0;
    do {
      psVar10 = sides;
      puVar8 = (uint *)((ulong)*(uint *)((long)&sidetemp->field_0 + lVar9 + 4) * 0x1e + (long)pvVar5
                       );
      if (gameinfo.gametype == GAME_Strife) {
        iVar4 = strncmp((char *)(puVar8 + 5),"LASERB01",8);
        if (iVar4 == 0) {
          *(short *)((long)puVar8 + 2) = *(short *)((long)puVar8 + 2) + 0x66;
        }
      }
      auVar12 = pshuflw(ZEXT416(*puVar8),ZEXT416(*puVar8),0x60);
      dVar11 = (double)(auVar12._0_4_ >> 0x10);
      dVar13 = (double)(auVar12._4_4_ >> 0x10);
      pdVar1 = (double *)((long)&psVar10->textures[2].xOffset + lVar7);
      *pdVar1 = dVar11;
      pdVar1[1] = dVar13;
      pdVar1 = (double *)((long)&psVar10->textures[1].xOffset + lVar7);
      *pdVar1 = dVar11;
      pdVar1[1] = dVar13;
      pdVar1 = (double *)((long)&psVar10->textures[0].xOffset + lVar7);
      *pdVar1 = dVar11;
      pdVar1[1] = dVar13;
      puVar2 = (undefined8 *)((long)&psVar10->textures[2].xScale + lVar7);
      *puVar2 = 0x3ff0000000000000;
      puVar2[1] = 0x3ff0000000000000;
      puVar2 = (undefined8 *)((long)&psVar10->textures[1].xScale + lVar7);
      *puVar2 = 0x3ff0000000000000;
      puVar2[1] = 0x3ff0000000000000;
      puVar2 = (undefined8 *)((long)&psVar10->textures[0].xScale + lVar7);
      *puVar2 = 0x3ff0000000000000;
      puVar2[1] = 0x3ff0000000000000;
      *(undefined8 *)((long)&psVar10->linedef + lVar7) = 0;
      (&psVar10->Flags)[lVar7] = '\0';
      *(int *)((long)&psVar10->Index + lVar7) = (int)uVar6;
      if ((uint)(int)(short)puVar8[7] < (uint)numsectors) {
        sec = sectors + (int)(short)puVar8[7];
      }
      else {
        Printf(2,"Sidedef %d has a bad sector\n",uVar6 & 0xffffffff);
        sec = (sector_t_conflict *)0x0;
      }
      psVar10 = (side_t *)((long)psVar10->textures + lVar7 + -0x10);
      psVar10->sector = sec;
      imsd.toptexture.Chars = FString::NullString.Nothing;
      imsd.bottomtexture.Chars = FString::NullString.Nothing;
      imsd.midtexture.Chars = FString::NullString.Nothing;
      FString::NullString.RefCount = FString::NullString.RefCount + 3;
      FString::CopyCStrPart(&imsd.toptexture,(char *)(puVar8 + 1),8);
      FString::CopyCStrPart(&imsd.midtexture,(char *)(puVar8 + 5),8);
      FString::CopyCStrPart(&imsd.bottomtexture,(char *)(puVar8 + 3),8);
      P_ProcessSideTextures
                ((bool)(map->HasBehavior ^ 1),psVar10,sec,&imsd,
                 (int)*(short *)((long)sidetemp + lVar9 + -2),
                 (int)*(short *)((long)sidetemp + lVar9 + -4),
                 (short *)((long)&sidetemp->field_0 + lVar9),missingtex);
      FString::~FString(&imsd.midtexture);
      FString::~FString(&imsd.bottomtexture);
      FString::~FString(&imsd.toptexture);
      uVar6 = uVar6 + 1;
      lVar9 = lVar9 + 0xc;
      lVar7 = lVar7 + 0xc0;
    } while ((long)uVar6 < (long)numsides);
  }
  operator_delete__(pvVar5);
  return;
}

Assistant:

void P_LoadSideDefs2 (MapData *map, FMissingTextureTracker &missingtex)
{
	int  i;
	char * msdf = new char[map->Size(ML_SIDEDEFS)];
	map->Read(ML_SIDEDEFS, msdf);

	for (i = 0; i < numsides; i++)
	{
		mapsidedef_t *msd = ((mapsidedef_t*)msdf) + sidetemp[i].a.map;
		side_t *sd = sides + i;
		sector_t *sec;

		// [RH] The Doom renderer ignored the patch y locations when
		// drawing mid textures. ZDoom does not, so fix the laser beams in Strife.
		if (gameinfo.gametype == GAME_Strife &&
			strncmp (msd->midtexture, "LASERB01", 8) == 0)
		{
			msd->rowoffset += 102;
		}

		sd->SetTextureXOffset(LittleShort(msd->textureoffset));
		sd->SetTextureYOffset(LittleShort(msd->rowoffset));
		sd->SetTextureXScale(1.);
		sd->SetTextureYScale(1.);
		sd->linedef = NULL;
		sd->Flags = 0;
		sd->Index = i;

		// killough 4/4/98: allow sidedef texture names to be overloaded
		// killough 4/11/98: refined to allow colormaps to work as wall
		// textures if invalid as colormaps but valid as textures.

		if ((unsigned)LittleShort(msd->sector)>=(unsigned)numsectors)
		{
			Printf (PRINT_HIGH, "Sidedef %d has a bad sector\n", i);
			sd->sector = sec = NULL;
		}
		else
		{
			sd->sector = sec = &sectors[LittleShort(msd->sector)];
		}

		intmapsidedef_t imsd;
		imsd.toptexture.CopyCStrPart(msd->toptexture, 8);
		imsd.midtexture.CopyCStrPart(msd->midtexture, 8);
		imsd.bottomtexture.CopyCStrPart(msd->bottomtexture, 8);

		P_ProcessSideTextures(!map->HasBehavior, sd, sec, &imsd, 
							  sidetemp[i].a.special, sidetemp[i].a.tag, &sidetemp[i].a.alpha, missingtex);
	}
	delete[] msdf;
}